

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::DoubleParameter::DoubleParameter(DoubleParameter *this,DoubleParameter *from)

{
  AllowedValuesCase AVar1;
  DoubleRange *this_00;
  DoubleRange *from_00;
  DoubleParameter *from_local;
  DoubleParameter *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__DoubleParameter_006f9e30;
  AllowedValuesUnion::AllowedValuesUnion((AllowedValuesUnion *)&this->AllowedValues_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  this->defaultvalue_ = from->defaultvalue_;
  clear_has_AllowedValues(this);
  AVar1 = AllowedValues_case(from);
  if ((AVar1 != ALLOWEDVALUES_NOT_SET) && (AVar1 == kRange)) {
    this_00 = _internal_mutable_range(this);
    from_00 = _internal_range(from);
    DoubleRange::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

DoubleParameter::DoubleParameter(const DoubleParameter& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  defaultvalue_ = from.defaultvalue_;
  clear_has_AllowedValues();
  switch (from.AllowedValues_case()) {
    case kRange: {
      _internal_mutable_range()->::CoreML::Specification::DoubleRange::MergeFrom(from._internal_range());
      break;
    }
    case ALLOWEDVALUES_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.DoubleParameter)
}